

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

char wabt::anon_unknown_0::CWriter::MangleType(Type type)

{
  Enum EVar1;
  Type local_14;
  Type type_local;
  
  local_14 = type;
  EVar1 = Type::operator_cast_to_Enum(&local_14);
  switch(EVar1) {
  case ExternRef:
    type_local.enum_._3_1_ = 0x65;
    break;
  case FuncRef:
    type_local.enum_._3_1_ = 0x72;
    break;
  default:
    abort();
  case V128:
    type_local.enum_._3_1_ = 0x6f;
    break;
  case F64:
    type_local.enum_._3_1_ = 100;
    break;
  case F32:
    type_local.enum_._3_1_ = 0x66;
    break;
  case I64:
    type_local.enum_._3_1_ = 0x6a;
    break;
  case I32:
    type_local.enum_._3_1_ = 0x69;
  }
  return type_local.enum_._3_1_;
}

Assistant:

constexpr char CWriter::MangleType(Type type) {
  // clang-format off
  switch (type) {
    case Type::I32: return 'i';
    case Type::I64: return 'j';
    case Type::F32: return 'f';
    case Type::F64: return 'd';
    case Type::V128: return 'o';
    case Type::FuncRef: return 'r';
    case Type::ExternRef: return 'e';
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}